

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

void Catch::cleanupSingletons(void)

{
  long *plVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  
  if ((anonymous_namespace)::getSingletons()::g_singletons == (undefined8 *)0x0) {
    (anonymous_namespace)::getSingletons()::g_singletons = (undefined8 *)operator_new(0x18);
    *(anonymous_namespace)::getSingletons()::g_singletons = 0;
    (anonymous_namespace)::getSingletons()::g_singletons[1] = 0;
    (anonymous_namespace)::getSingletons()::g_singletons[2] = 0;
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)*(anonymous_namespace)::getSingletons()::g_singletons;
  }
  plVar1 = (long *)(anonymous_namespace)::getSingletons()::g_singletons[1];
  if (plVar4 != plVar1) {
    do {
      if ((long *)*plVar4 != (long *)0x0) {
        (**(code **)(*(long *)*plVar4 + 8))();
      }
      plVar4 = plVar4 + 1;
    } while (plVar4 != plVar1);
    if ((anonymous_namespace)::getSingletons()::g_singletons == (undefined8 *)0x0) {
      puVar3 = (undefined8 *)0x0;
      goto LAB_00124329;
    }
  }
  puVar3 = (anonymous_namespace)::getSingletons()::g_singletons;
  pvVar2 = (void *)*(anonymous_namespace)::getSingletons()::g_singletons;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(anonymous_namespace)::getSingletons()::g_singletons[2] - (long)pvVar2);
  }
LAB_00124329:
  operator_delete(puVar3,0x18);
  (anonymous_namespace)::getSingletons()::g_singletons = (undefined8 *)0x0;
  return;
}

Assistant:

static auto getSingletons() -> std::vector<ISingleton*>*& {
            static std::vector<ISingleton*>* g_singletons = nullptr;
            if( !g_singletons )
                g_singletons = new std::vector<ISingleton*>();
            return g_singletons;
        }